

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>>,std::error_code>,std::allocator<void>>
          (executor_function *this,
          binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_std::error_code>
          *f,allocator<void> *a)

{
  _func_void_impl_base_ptr_bool *p_Var1;
  error_category *peVar2;
  long *plVar3;
  impl_base *piVar4;
  undefined8 uVar5;
  ptr local_40;
  
  local_40.a = a;
  plVar3 = (long *)__tls_get_addr(&PTR_00234a10);
  if (*plVar3 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined8 *)(*plVar3 + 8);
  }
  piVar4 = (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar5,0xb8,8);
  local_40.p = (impl<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_std::error_code>,_std::allocator<void>_>
                *)0x0;
  piVar4[1].complete_ = (_func_void_impl_base_ptr_bool *)(f->handler_).next_layer_;
  piVar4[2].complete_ = (_func_void_impl_base_ptr_bool *)(f->handler_).core_;
  p_Var1 = (_func_void_impl_base_ptr_bool *)(f->handler_).op_.buffers_.super_mutable_buffer.size_;
  piVar4[3].complete_ =
       (_func_void_impl_base_ptr_bool *)(f->handler_).op_.buffers_.super_mutable_buffer.data_;
  piVar4[4].complete_ = p_Var1;
  piVar4[5].complete_ = *(_func_void_impl_base_ptr_bool **)&(f->handler_).start_;
  peVar2 = (f->handler_).ec_._M_cat;
  piVar4[6].complete_ = *(_func_void_impl_base_ptr_bool **)&(f->handler_).ec_;
  piVar4[7].complete_ = (_func_void_impl_base_ptr_bool *)peVar2;
  piVar4[8].complete_ = (_func_void_impl_base_ptr_bool *)(f->handler_).bytes_transferred_;
  read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
  ::read_op((read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
             *)(piVar4 + 9),&(f->handler_).handler_);
  peVar2 = (f->arg1_)._M_cat;
  piVar4[0x14].complete_ = *(_func_void_impl_base_ptr_bool **)&f->arg1_;
  piVar4[0x15].complete_ = (_func_void_impl_base_ptr_bool *)peVar2;
  piVar4->complete_ =
       complete<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>>,std::error_code>,std::allocator<void>>
  ;
  this->impl_ = piVar4;
  local_40.v = (void *)0x0;
  impl<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>_>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_40);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(ASIO_MOVE_CAST(F)(f), a);
    p.v = 0;
  }